

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMiIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  float fVar3;
  undefined4 uVar4;
  Scene *pSVar5;
  float **ppfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  NodeRef *pNVar25;
  size_t sVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  float fVar44;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar45 [32];
  undefined1 auVar49 [16];
  uint uVar50;
  uint uVar51;
  uint uVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar65 [64];
  NodeRef *local_14f0;
  undefined1 local_14c8 [16];
  Geometry *local_14b8;
  ulong local_14b0;
  ulong local_14a8;
  long local_14a0;
  ulong local_1498;
  long local_1490;
  RTCFilterFunctionNArguments args;
  float old_t;
  undefined8 local_1438;
  undefined8 uStack_1430;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined1 local_1418 [16];
  undefined1 local_1408 [16];
  undefined1 local_13f8 [16];
  undefined1 local_13e8 [16];
  byte local_13d7;
  float local_13c8 [4];
  undefined1 local_13b8 [16];
  float local_13a8 [4];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  RTCHitN local_1368 [16];
  undefined1 local_1358 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  undefined1 local_1318 [16];
  undefined1 local_1308 [16];
  uint local_12f8;
  uint uStack_12f4;
  uint uStack_12f0;
  uint uStack_12ec;
  uint uStack_12e8;
  uint uStack_12e4;
  uint uStack_12e0;
  uint uStack_12dc;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  NodeRef stack [564];
  
  stack[0] = root;
  auVar41 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar54 = ZEXT3264(auVar41);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar55 = ZEXT3264(auVar42);
  auVar43 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar56 = ZEXT3264(auVar43);
  auVar28 = vmulss_avx512f(auVar41._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar29 = vmulss_avx512f(auVar42._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar41._0_4_ = auVar28._0_4_;
  auVar41._4_4_ = auVar41._0_4_;
  auVar41._8_4_ = auVar41._0_4_;
  auVar41._12_4_ = auVar41._0_4_;
  auVar41._16_4_ = auVar41._0_4_;
  auVar41._20_4_ = auVar41._0_4_;
  auVar41._24_4_ = auVar41._0_4_;
  auVar41._28_4_ = auVar41._0_4_;
  auVar42._0_4_ = auVar29._0_4_;
  auVar42._4_4_ = auVar42._0_4_;
  auVar42._8_4_ = auVar42._0_4_;
  auVar42._12_4_ = auVar42._0_4_;
  auVar42._16_4_ = auVar42._0_4_;
  auVar42._20_4_ = auVar42._0_4_;
  auVar42._24_4_ = auVar42._0_4_;
  auVar42._28_4_ = auVar42._0_4_;
  auVar28 = vmulss_avx512f(auVar43._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar43._0_4_ = auVar28._0_4_;
  auVar43._4_4_ = auVar43._0_4_;
  auVar43._8_4_ = auVar43._0_4_;
  auVar43._12_4_ = auVar43._0_4_;
  auVar43._16_4_ = auVar43._0_4_;
  auVar43._20_4_ = auVar43._0_4_;
  auVar43._24_4_ = auVar43._0_4_;
  auVar43._28_4_ = auVar43._0_4_;
  uVar24 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar21 = uVar24 ^ 0x20;
  auVar45._8_4_ = 0x80000000;
  auVar45._0_8_ = 0x8000000080000000;
  auVar45._12_4_ = 0x80000000;
  auVar45._16_4_ = 0x80000000;
  auVar45._20_4_ = 0x80000000;
  auVar45._24_4_ = 0x80000000;
  auVar45._28_4_ = 0x80000000;
  auVar41 = vxorps_avx512vl(auVar41,auVar45);
  auVar57 = ZEXT3264(auVar41);
  auVar41 = vxorps_avx512vl(auVar42,auVar45);
  auVar58 = ZEXT3264(auVar41);
  auVar41 = vxorps_avx512vl(auVar43,auVar45);
  auVar59 = ZEXT3264(auVar41);
  auVar41 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar60 = ZEXT3264(auVar41);
  auVar41 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar61 = ZEXT3264(auVar41);
  auVar28 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar62 = ZEXT1664(auVar28);
  auVar28 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar63 = ZEXT1664(auVar28);
  auVar28 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar64 = ZEXT1664(auVar28);
  auVar28 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar65 = ZEXT1664(auVar28);
  local_14f0 = stack + 1;
  local_1498 = uVar24;
LAB_01d94398:
  do {
    pNVar25 = local_14f0;
    if (pNVar25 == stack) {
LAB_01d94b20:
      return pNVar25 != stack;
    }
    local_14f0 = pNVar25 + -1;
    sVar26 = pNVar25[-1].ptr;
    while ((sVar26 & 8) == 0) {
      auVar41 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(sVar26 + 0x40 + uVar24),auVar57._0_32_,
                           auVar54._0_32_);
      auVar42 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(sVar26 + 0x40 + uVar20),auVar58._0_32_,
                           auVar55._0_32_);
      auVar41 = vpmaxsd_avx2(auVar41,auVar42);
      auVar42 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(sVar26 + 0x40 + uVar27),auVar59._0_32_,
                           auVar56._0_32_);
      auVar42 = vpmaxsd_avx512vl(auVar42,auVar60._0_32_);
      auVar41 = vpmaxsd_avx2(auVar41,auVar42);
      auVar42 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(sVar26 + 0x40 + uVar21),auVar57._0_32_,
                           auVar54._0_32_);
      auVar43 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(sVar26 + 0x40 + (uVar20 ^ 0x20)),auVar58._0_32_,
                           auVar55._0_32_);
      auVar42 = vpminsd_avx2(auVar42,auVar43);
      auVar43 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(sVar26 + 0x40 + (uVar27 ^ 0x20)),auVar59._0_32_,
                           auVar56._0_32_);
      auVar43 = vpminsd_avx512vl(auVar43,auVar61._0_32_);
      auVar42 = vpminsd_avx2(auVar42,auVar43);
      uVar23 = vpcmpd_avx512vl(auVar41,auVar42,2);
      if ((char)uVar23 == '\0') goto LAB_01d94398;
      uVar18 = sVar26 & 0xfffffffffffffff0;
      lVar19 = 0;
      for (uVar17 = uVar23; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
        lVar19 = lVar19 + 1;
      }
      sVar26 = *(size_t *)(uVar18 + lVar19 * 8);
      uVar22 = (uint)uVar23 - 1 & (uint)uVar23;
      uVar23 = (ulong)uVar22;
      if (uVar22 != 0) {
        do {
          local_14f0->ptr = sVar26;
          local_14f0 = local_14f0 + 1;
          lVar19 = 0;
          for (uVar17 = uVar23; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
            lVar19 = lVar19 + 1;
          }
          uVar23 = uVar23 - 1 & uVar23;
          sVar26 = *(size_t *)(uVar18 + lVar19 * 8);
        } while (uVar23 != 0);
      }
    }
    local_1490 = (ulong)((uint)sVar26 & 0xf) - 8;
    uVar23 = sVar26 & 0xfffffffffffffff0;
    for (local_14a0 = 0; local_14a0 != local_1490; local_14a0 = local_14a0 + 1) {
      lVar19 = local_14a0 * 0x50;
      pSVar5 = context->scene;
      ppfVar6 = (pSVar5->vertices).items;
      pfVar7 = ppfVar6[*(uint *)(uVar23 + 0x30 + lVar19)];
      pfVar8 = ppfVar6[*(uint *)(uVar23 + 0x34 + lVar19)];
      pfVar9 = ppfVar6[*(uint *)(uVar23 + 0x38 + lVar19)];
      pfVar10 = ppfVar6[*(uint *)(uVar23 + 0x3c + lVar19)];
      auVar40 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar23 + lVar19)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar23 + 8 + lVar19)));
      auVar28 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar23 + lVar19)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar23 + 8 + lVar19)));
      auVar49 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar23 + 4 + lVar19)),
                              *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar23 + 0xc + lVar19)));
      auVar29 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar23 + 4 + lVar19)),
                              *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar23 + 0xc + lVar19)));
      auVar35 = vunpcklps_avx(auVar28,auVar29);
      auVar33 = vunpcklps_avx(auVar40,auVar49);
      auVar34 = vunpckhps_avx(auVar40,auVar49);
      auVar40 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar23 + 0x10 + lVar19)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar23 + 0x18 + lVar19)));
      auVar28 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar23 + 0x10 + lVar19)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar23 + 0x18 + lVar19)));
      auVar49 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar23 + 0x14 + lVar19)),
                              *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar23 + 0x1c + lVar19)));
      auVar29 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar23 + 0x14 + lVar19)),
                              *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar23 + 0x1c + lVar19)));
      auVar38 = vunpcklps_avx(auVar28,auVar29);
      auVar32 = vunpcklps_avx(auVar40,auVar49);
      auVar29 = vunpckhps_avx(auVar40,auVar49);
      auVar49 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar23 + 0x20 + lVar19)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar23 + 0x28 + lVar19)));
      auVar28 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar23 + 0x20 + lVar19)),
                              *(undefined1 (*) [16])(pfVar9 + *(uint *)(uVar23 + 0x28 + lVar19)));
      auVar39 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar23 + 0x24 + lVar19)),
                              *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar23 + 0x2c + lVar19)));
      auVar40 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar23 + 0x24 + lVar19)),
                              *(undefined1 (*) [16])(pfVar10 + *(uint *)(uVar23 + 0x2c + lVar19)));
      auVar30 = vunpcklps_avx(auVar28,auVar40);
      auVar31 = vunpcklps_avx(auVar49,auVar39);
      puVar1 = (undefined8 *)(uVar23 + 0x30 + lVar19);
      local_1428 = *puVar1;
      uStack_1420 = puVar1[1];
      auVar39 = vunpckhps_avx(auVar49,auVar39);
      puVar1 = (undefined8 *)(uVar23 + 0x40 + lVar19);
      local_1438 = *puVar1;
      uStack_1430 = puVar1[1];
      auVar28 = vsubps_avx(auVar33,auVar32);
      auVar29 = vsubps_avx(auVar34,auVar29);
      auVar40 = vsubps_avx(auVar35,auVar38);
      auVar49 = vsubps_avx(auVar31,auVar33);
      auVar39 = vsubps_avx(auVar39,auVar34);
      auVar38 = vsubps_avx(auVar30,auVar35);
      auVar30._0_4_ = auVar29._0_4_ * auVar38._0_4_;
      auVar30._4_4_ = auVar29._4_4_ * auVar38._4_4_;
      auVar30._8_4_ = auVar29._8_4_ * auVar38._8_4_;
      auVar30._12_4_ = auVar29._12_4_ * auVar38._12_4_;
      local_1398 = vfmsub231ps_fma(auVar30,auVar39,auVar40);
      auVar31._0_4_ = auVar40._0_4_ * auVar49._0_4_;
      auVar31._4_4_ = auVar40._4_4_ * auVar49._4_4_;
      auVar31._8_4_ = auVar40._8_4_ * auVar49._8_4_;
      auVar31._12_4_ = auVar40._12_4_ * auVar49._12_4_;
      local_1388 = vfmsub231ps_fma(auVar31,auVar38,auVar28);
      auVar36._0_4_ = auVar28._0_4_ * auVar39._0_4_;
      auVar36._4_4_ = auVar28._4_4_ * auVar39._4_4_;
      auVar36._8_4_ = auVar28._8_4_ * auVar39._8_4_;
      auVar36._12_4_ = auVar28._12_4_ * auVar39._12_4_;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar53._4_4_ = uVar2;
      auVar53._0_4_ = uVar2;
      auVar53._8_4_ = uVar2;
      auVar53._12_4_ = uVar2;
      auVar30 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
      auVar31 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
      uVar2 = *(undefined4 *)(ray + k * 4);
      auVar32._4_4_ = uVar2;
      auVar32._0_4_ = uVar2;
      auVar32._8_4_ = uVar2;
      auVar32._12_4_ = uVar2;
      auVar32 = vsubps_avx512vl(auVar33,auVar32);
      local_1378 = vfmsub231ps_fma(auVar36,auVar49,auVar29);
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar33._4_4_ = uVar2;
      auVar33._0_4_ = uVar2;
      auVar33._8_4_ = uVar2;
      auVar33._12_4_ = uVar2;
      auVar33 = vsubps_avx512vl(auVar34,auVar33);
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar34._4_4_ = uVar2;
      auVar34._0_4_ = uVar2;
      auVar34._8_4_ = uVar2;
      auVar34._12_4_ = uVar2;
      auVar34 = vsubps_avx512vl(auVar35,auVar34);
      auVar35 = vmulps_avx512vl(auVar30,auVar34);
      auVar35 = vfmsub231ps_avx512vl(auVar35,auVar33,auVar31);
      auVar36 = vmulps_avx512vl(auVar31,auVar32);
      auVar36 = vfmsub231ps_avx512vl(auVar36,auVar34,auVar53);
      auVar37 = vmulps_avx512vl(auVar53,auVar33);
      auVar37 = vfmsub231ps_avx512vl(auVar37,auVar32,auVar30);
      auVar31 = vmulps_avx512vl(local_1378,auVar31);
      auVar30 = vfmadd231ps_avx512vl(auVar31,local_1388,auVar30);
      auVar30 = vfmadd231ps_avx512vl(auVar30,local_1398,auVar53);
      local_13e8 = vandps_avx512vl(auVar30,auVar63._0_16_);
      auVar31 = vandps_avx512vl(auVar30,auVar64._0_16_);
      auVar38 = vmulps_avx512vl(auVar38,auVar37);
      auVar39 = vfmadd231ps_avx512vl(auVar38,auVar36,auVar39);
      auVar49 = vfmadd231ps_fma(auVar39,auVar35,auVar49);
      uVar22 = auVar31._0_4_;
      local_1418._0_4_ = (float)(uVar22 ^ auVar49._0_4_);
      uVar50 = auVar31._4_4_;
      local_1418._4_4_ = (float)(uVar50 ^ auVar49._4_4_);
      uVar51 = auVar31._8_4_;
      local_1418._8_4_ = (float)(uVar51 ^ auVar49._8_4_);
      uVar52 = auVar31._12_4_;
      local_1418._12_4_ = (float)(uVar52 ^ auVar49._12_4_);
      auVar40 = vmulps_avx512vl(auVar40,auVar37);
      auVar29 = vfmadd231ps_avx512vl(auVar40,auVar29,auVar36);
      auVar28 = vfmadd231ps_fma(auVar29,auVar28,auVar35);
      local_1408._0_4_ = (float)(uVar22 ^ auVar28._0_4_);
      local_1408._4_4_ = (float)(uVar50 ^ auVar28._4_4_);
      local_1408._8_4_ = (float)(uVar51 ^ auVar28._8_4_);
      local_1408._12_4_ = (float)(uVar52 ^ auVar28._12_4_);
      auVar28 = auVar65._0_16_;
      uVar13 = vcmpps_avx512vl(local_1418,auVar28,5);
      uVar14 = vcmpps_avx512vl(local_1408,auVar28,5);
      uVar15 = vcmpps_avx512vl(auVar30,auVar28,4);
      auVar28._0_4_ = local_1418._0_4_ + local_1408._0_4_;
      auVar28._4_4_ = local_1418._4_4_ + local_1408._4_4_;
      auVar28._8_4_ = local_1418._8_4_ + local_1408._8_4_;
      auVar28._12_4_ = local_1418._12_4_ + local_1408._12_4_;
      uVar16 = vcmpps_avx512vl(auVar28,local_13e8,2);
      local_13d7 = (byte)uVar13 & (byte)uVar14 & (byte)uVar15 & (byte)uVar16;
      if (local_13d7 != 0) {
        auVar40._0_4_ = auVar34._0_4_ * local_1378._0_4_;
        auVar40._4_4_ = auVar34._4_4_ * local_1378._4_4_;
        auVar40._8_4_ = auVar34._8_4_ * local_1378._8_4_;
        auVar40._12_4_ = auVar34._12_4_ * local_1378._12_4_;
        auVar28 = vfmadd213ps_fma(auVar33,local_1388,auVar40);
        auVar28 = vfmadd213ps_fma(auVar32,local_1398,auVar28);
        uVar2 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar29._4_4_ = uVar2;
        auVar29._0_4_ = uVar2;
        auVar29._8_4_ = uVar2;
        auVar29._12_4_ = uVar2;
        auVar29 = vmulps_avx512vl(local_13e8,auVar29);
        fVar3 = *(float *)(ray + k * 4 + 0x80);
        local_13f8._0_4_ = (float)(uVar22 ^ auVar28._0_4_);
        local_13f8._4_4_ = (float)(uVar50 ^ auVar28._4_4_);
        local_13f8._8_4_ = (float)(uVar51 ^ auVar28._8_4_);
        local_13f8._12_4_ = (float)(uVar52 ^ auVar28._12_4_);
        auVar49._0_4_ = fVar3 * local_13e8._0_4_;
        auVar49._4_4_ = fVar3 * local_13e8._4_4_;
        auVar49._8_4_ = fVar3 * local_13e8._8_4_;
        auVar49._12_4_ = fVar3 * local_13e8._12_4_;
        uVar13 = vcmpps_avx512vl(local_13f8,auVar49,2);
        uVar14 = vcmpps_avx512vl(auVar29,local_13f8,1);
        local_13d7 = (byte)uVar13 & (byte)uVar14 & local_13d7;
        if (local_13d7 != 0) {
          auVar28 = vrcp14ps_avx512vl(local_13e8);
          auVar39._8_4_ = 0x3f800000;
          auVar39._0_8_ = 0x3f8000003f800000;
          auVar39._12_4_ = 0x3f800000;
          auVar29 = vfnmadd213ps_avx512vl(local_13e8,auVar28,auVar39);
          auVar28 = vfmadd132ps_fma(auVar29,auVar28,auVar28);
          fVar44 = auVar28._0_4_;
          fVar46 = auVar28._4_4_;
          fVar47 = auVar28._8_4_;
          fVar48 = auVar28._12_4_;
          local_13a8[0] = fVar44 * local_13f8._0_4_;
          local_13a8[1] = fVar46 * local_13f8._4_4_;
          local_13a8[2] = fVar47 * local_13f8._8_4_;
          local_13a8[3] = fVar48 * local_13f8._12_4_;
          local_13c8[0] = fVar44 * local_1418._0_4_;
          local_13c8[1] = fVar46 * local_1418._4_4_;
          local_13c8[2] = fVar47 * local_1418._8_4_;
          local_13c8[3] = fVar48 * local_1418._12_4_;
          local_13b8._0_4_ = fVar44 * local_1408._0_4_;
          local_13b8._4_4_ = fVar46 * local_1408._4_4_;
          local_13b8._8_4_ = fVar47 * local_1408._8_4_;
          local_13b8._12_4_ = fVar48 * local_1408._12_4_;
          local_14a8 = (ulong)local_13d7;
          do {
            auVar28 = auVar65._0_16_;
            local_14b0 = 0;
            for (uVar24 = local_14a8; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000)
            {
              local_14b0 = local_14b0 + 1;
            }
            local_14b8 = (pSVar5->geometries).items[*(uint *)((long)&local_1428 + local_14b0 * 4)].
                         ptr;
            if ((local_14b8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              local_14a8 = local_14a8 ^ 1L << (local_14b0 & 0x3f);
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (local_14b8->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01d94b14:
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                goto LAB_01d94b20;
              }
              local_12d8 = vmovdqu64_avx512vl(auVar61._0_32_);
              local_12b8 = vmovdqu64_avx512vl(auVar60._0_32_);
              local_1298 = auVar59._0_32_;
              local_1278 = auVar58._0_32_;
              local_1258 = auVar57._0_32_;
              local_1238 = auVar56._0_32_;
              local_1218 = auVar55._0_32_;
              local_11f8 = auVar54._0_32_;
              uVar24 = (ulong)(uint)((int)local_14b0 * 4);
              uVar2 = *(undefined4 *)((long)local_13c8 + uVar24);
              local_1338._4_4_ = uVar2;
              local_1338._0_4_ = uVar2;
              local_1338._8_4_ = uVar2;
              local_1338._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(local_13b8 + uVar24);
              local_1328._4_4_ = uVar2;
              local_1328._0_4_ = uVar2;
              local_1328._8_4_ = uVar2;
              local_1328._12_4_ = uVar2;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)local_13a8 + uVar24);
              args.context = context->user;
              local_1308 = vpbroadcastd_avx512vl();
              uVar2 = *(undefined4 *)((long)&local_1438 + uVar24);
              local_1318._4_4_ = uVar2;
              local_1318._0_4_ = uVar2;
              local_1318._8_4_ = uVar2;
              local_1318._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(local_1398 + uVar24);
              uVar4 = *(undefined4 *)(local_1388 + uVar24);
              local_1358._4_4_ = uVar4;
              local_1358._0_4_ = uVar4;
              local_1358._8_4_ = uVar4;
              local_1358._12_4_ = uVar4;
              uVar4 = *(undefined4 *)(local_1378 + uVar24);
              local_1348._4_4_ = uVar4;
              local_1348._0_4_ = uVar4;
              local_1348._8_4_ = uVar4;
              local_1348._12_4_ = uVar4;
              local_1368[0] = (RTCHitN)(char)uVar2;
              local_1368[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
              local_1368[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
              local_1368[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
              local_1368[4] = (RTCHitN)(char)uVar2;
              local_1368[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
              local_1368[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
              local_1368[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
              local_1368[8] = (RTCHitN)(char)uVar2;
              local_1368[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
              local_1368[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
              local_1368[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
              local_1368[0xc] = (RTCHitN)(char)uVar2;
              local_1368[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
              local_1368[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
              local_1368[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
              vpcmpeqd_avx2(ZEXT1632(local_1308),ZEXT1632(local_1308));
              uStack_12f4 = (args.context)->instID[0];
              local_12f8 = uStack_12f4;
              uStack_12f0 = uStack_12f4;
              uStack_12ec = uStack_12f4;
              uStack_12e8 = (args.context)->instPrimID[0];
              uStack_12e4 = uStack_12e8;
              uStack_12e0 = uStack_12e8;
              uStack_12dc = uStack_12e8;
              auVar40 = auVar62._0_16_;
              local_14c8 = vmovdqa64_avx512vl(auVar40);
              args.valid = (int *)local_14c8;
              args.geometryUserPtr = local_14b8->userPtr;
              args.hit = local_1368;
              args.N = 4;
              auVar29 = vmovdqa64_avx512vl(auVar40);
              auVar40 = vmovdqa64_avx512vl(auVar40);
              args.ray = (RTCRayN *)ray;
              if (local_14b8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*local_14b8->occlusionFilterN)(&args);
                auVar40 = local_14c8;
              }
              uVar24 = vptestmd_avx512vl(auVar40,auVar40);
              if ((uVar24 & 0xf) != 0) {
                p_Var11 = context->args->filter;
                if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                    (((local_14b8->field_8).field_0x2 & 0x40) != 0)))) {
                  (*p_Var11)(&args);
                  auVar40 = local_14c8;
                }
                uVar24 = vptestmd_avx512vl(auVar40,auVar40);
                uVar24 = uVar24 & 0xf;
                auVar40 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar12 = (bool)((byte)uVar24 & 1);
                auVar38._0_4_ =
                     (uint)bVar12 * auVar40._0_4_ | (uint)!bVar12 * *(int *)(args.ray + 0x80);
                bVar12 = (bool)((byte)(uVar24 >> 1) & 1);
                auVar38._4_4_ =
                     (uint)bVar12 * auVar40._4_4_ | (uint)!bVar12 * *(int *)(args.ray + 0x84);
                bVar12 = (bool)((byte)(uVar24 >> 2) & 1);
                auVar38._8_4_ =
                     (uint)bVar12 * auVar40._8_4_ | (uint)!bVar12 * *(int *)(args.ray + 0x88);
                bVar12 = SUB81(uVar24 >> 3,0);
                auVar38._12_4_ =
                     (uint)bVar12 * auVar40._12_4_ | (uint)!bVar12 * *(int *)(args.ray + 0x8c);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar38;
                if ((byte)uVar24 != 0) goto LAB_01d94b14;
              }
              *(float *)(ray + k * 4 + 0x80) = fVar3;
              local_14a8 = local_14a8 ^ 1L << (local_14b0 & 0x3f);
              auVar54 = ZEXT3264(local_11f8);
              auVar55 = ZEXT3264(local_1218);
              auVar56 = ZEXT3264(local_1238);
              auVar57 = ZEXT3264(local_1258);
              auVar58 = ZEXT3264(local_1278);
              auVar59 = ZEXT3264(local_1298);
              auVar41 = vmovdqu64_avx512vl(local_12b8);
              auVar60 = ZEXT3264(auVar41);
              auVar41 = vmovdqu64_avx512vl(local_12d8);
              auVar61 = ZEXT3264(auVar41);
              auVar29 = vmovdqa64_avx512vl(auVar29);
              auVar62 = ZEXT1664(auVar29);
              auVar29 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar63 = ZEXT1664(auVar29);
              auVar29 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar64 = ZEXT1664(auVar29);
              auVar28 = vxorps_avx512vl(auVar28,auVar28);
              auVar65 = ZEXT1664(auVar28);
            }
          } while (local_14a8 != 0);
        }
      }
      uVar24 = local_1498;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }